

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcIndexedFaceSet.h
# Opt level: O0

void __thiscall
o3dgc::IndexedFaceSet<unsigned_short>::IndexedFaceSet(IndexedFaceSet<unsigned_short> *this)

{
  IndexedFaceSet<unsigned_short> *this_local;
  
  memset(this,0,80000);
  this->m_ccw = true;
  this->m_solid = true;
  this->m_convex = true;
  this->m_isTriangularMesh = true;
  this->m_creaseAngle = 30.0;
  return;
}

Assistant:

IndexedFaceSet(void)
                                         {
                                             memset(this, 0, sizeof(IndexedFaceSet));
                                             m_ccw              = true;
                                             m_solid            = true;
                                             m_convex           = true;
                                             m_isTriangularMesh = true;
                                             m_creaseAngle      = 30;
                                         }